

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

VP8StatusCode WebPIUpdate(WebPIDecoder *idec,uint8_t *data,size_t data_size)

{
  int iVar1;
  WebPIDecoder *in_RSI;
  WebPIDecoder *in_RDI;
  VP8StatusCode status;
  uint8_t *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  VP8StatusCode VVar2;
  
  if ((in_RDI == (WebPIDecoder *)0x0) || (in_RSI == (WebPIDecoder *)0x0)) {
    VVar2 = VP8_STATUS_INVALID_PARAM;
  }
  else {
    VVar2 = IDecCheckStatus(in_RDI);
    if (VVar2 == VP8_STATUS_SUSPENDED) {
      iVar1 = CheckMemBufferMode(&in_RDI->mem,MEM_MODE_MAP);
      if (iVar1 == 0) {
        VVar2 = VP8_STATUS_INVALID_PARAM;
      }
      else {
        iVar1 = RemapMemBuffer((WebPIDecoder *)data_size,unaff_retaddr,
                               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
        if (iVar1 == 0) {
          VVar2 = VP8_STATUS_INVALID_PARAM;
        }
        else {
          VVar2 = IDecode(in_RSI);
        }
      }
    }
  }
  return VVar2;
}

Assistant:

VP8StatusCode WebPIUpdate(WebPIDecoder* idec,
                          const uint8_t* data, size_t data_size) {
  VP8StatusCode status;
  if (idec == NULL || data == NULL) {
    return VP8_STATUS_INVALID_PARAM;
  }
  status = IDecCheckStatus(idec);
  if (status != VP8_STATUS_SUSPENDED) {
    return status;
  }
  // Check mixed calls between RemapMemBuffer and AppendToMemBuffer.
  if (!CheckMemBufferMode(&idec->mem, MEM_MODE_MAP)) {
    return VP8_STATUS_INVALID_PARAM;
  }
  // Make the memory buffer point to the new buffer
  if (!RemapMemBuffer(idec, data, data_size)) {
    return VP8_STATUS_INVALID_PARAM;
  }
  return IDecode(idec);
}